

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O2

bool __thiscall
BamTools::Fasta::FastaPrivate::Open(FastaPrivate *this,string *filename,string *indexFilename)

{
  bool bVar1;
  FILE *pFVar2;
  ostream *poVar3;
  char *pcVar4;
  
  pFVar2 = fopen64((filename->_M_dataplus)._M_p,"rb");
  this->Stream = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"FASTA error: Could not open ");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    pcVar4 = " for reading";
  }
  else {
    this->IsOpen = true;
    if (indexFilename->_M_string_length == 0) {
      return true;
    }
    pFVar2 = fopen64((indexFilename->_M_dataplus)._M_p,"rb");
    this->IndexStream = (FILE *)pFVar2;
    if (pFVar2 != (FILE *)0x0) {
      this->IsIndexOpen = true;
      bVar1 = LoadIndexData(this);
      this->HasIndex = bVar1;
      return bVar1;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"FASTA error : Could not open ");
    poVar3 = std::operator<<(poVar3,(string *)indexFilename);
    pcVar4 = " for reading.";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

bool Fasta::FastaPrivate::Open(const std::string& filename, const std::string& indexFilename)
{

    bool success = true;

    // open FASTA filename
    Stream = fopen(filename.c_str(), "rb");
    if (!Stream) {
        std::cerr << "FASTA error: Could not open " << filename << " for reading" << std::endl;
        return false;
    }
    IsOpen = true;
    success &= IsOpen;

    // open index file if it exists
    if (!indexFilename.empty()) {
        IndexStream = fopen(indexFilename.c_str(), "rb");
        if (!IndexStream) {
            std::cerr << "FASTA error : Could not open " << indexFilename << " for reading."
                      << std::endl;
            return false;
        }
        IsIndexOpen = true;
        success &= IsIndexOpen;

        // attempt to load index data
        HasIndex = LoadIndexData();
        success &= HasIndex;
    }

    // return success status
    return success;
}